

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m3x3.cpp
# Opt level: O0

void M3x3_ExtractEulerAngles_YZX(double (*matrix) [3],double *angles)

{
  double *in_RSI;
  double *in_RDI;
  double __x;
  double dVar1;
  double cosZ;
  double az;
  double ay;
  double ax;
  double local_20;
  double local_18;
  
  if ((*in_RDI != 9999999.0) || (NAN(*in_RDI))) {
    __x = sqrt(*in_RDI * *in_RDI + in_RDI[6] * in_RDI[6]);
    dVar1 = atan2(in_RDI[3],__x);
    if (0.0001 <= __x) {
      local_18 = atan2(-in_RDI[5],in_RDI[4]);
      local_20 = atan2(-in_RDI[6],*in_RDI);
    }
    else {
      local_18 = atan2(in_RDI[7],in_RDI[8]);
      local_20 = 0.0;
    }
    *in_RSI = local_18 * 57.29577951308232;
    in_RSI[1] = local_20 * 57.29577951308232;
    in_RSI[2] = dVar1 * 57.29577951308232;
  }
  else {
    *in_RSI = 9999999.0;
    in_RSI[1] = 9999999.0;
    in_RSI[2] = 9999999.0;
  }
  return;
}

Assistant:

void M3x3_ExtractEulerAngles_YZX(
  double matrix[3][3],
  double angles[3])
{
    double ax,ay,az;
    double cosZ;

/*
   R[YZX] = Ry * Rz * Rx

             | cy   0   sy |   | cz   -sz   0 |   | 1    0    0 |
          =  |  0   1    0 | * | sz    cz   0 | * | 0   cx  -sx |
             |-sy   0   cy |   |  0     0   1 |   | 0   sx   cx |


            | cycz    -cxcysz + sxsy    sxcysz + cxsy |
          = |   sz     cxcz            -sxcz          |
            |-sycz     cxsysz + sxcy   -sxsysz + cxcy |
*/

    if (matrix[0][0] == XEMPTY)
    {
        angles[0] = XEMPTY;
        angles[1] = XEMPTY;
        angles[2] = XEMPTY;
        return;
    }

    cosZ = sqrt(matrix[0][0]*matrix[0][0] + matrix[2][0]*matrix[2][0]);

    az = atan2(matrix[1][0], cosZ);

    if (cosZ < 0.0001)
    {
     // Gimble lock: set first angle to zero.
     // Assume sz=+-1,cz=0,sy=0,cy=1.0 and decode the matrix accordingly

        ax = atan2(matrix[2][1], matrix[2][2]);
        ay = 0.0;
    }
    else
    {
        ax = atan2(-matrix[1][2], matrix[1][1]);
        ay = atan2(-matrix[2][0], matrix[0][0]);
    }

    angles[0] = ax * (180.0/M_PI);
    angles[1] = ay * (180.0/M_PI);
    angles[2] = az * (180.0/M_PI);
}